

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t avx2_countspaces(char *bytes,size_t howmany)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  if (howmany < 0x20) {
    uVar6 = 0;
    sVar5 = 0;
  }
  else {
    uVar6 = howmany & 0xffffffffffffffe0;
    uVar7 = 0x1f;
    sVar5 = 0;
    auVar8[8] = 0x20;
    auVar8._0_8_ = 0x2020202020202020;
    auVar8[9] = 0x20;
    auVar8[10] = 0x20;
    auVar8[0xb] = 0x20;
    auVar8[0xc] = 0x20;
    auVar8[0xd] = 0x20;
    auVar8[0xe] = 0x20;
    auVar8[0xf] = 0x20;
    auVar8[0x10] = 0x20;
    auVar8[0x11] = 0x20;
    auVar8[0x12] = 0x20;
    auVar8[0x13] = 0x20;
    auVar8[0x14] = 0x20;
    auVar8[0x15] = 0x20;
    auVar8[0x16] = 0x20;
    auVar8[0x17] = 0x20;
    auVar8[0x18] = 0x20;
    auVar8[0x19] = 0x20;
    auVar8[0x1a] = 0x20;
    auVar8[0x1b] = 0x20;
    auVar8[0x1c] = 0x20;
    auVar8[0x1d] = 0x20;
    auVar8[0x1e] = 0x20;
    auVar8[0x1f] = 0x20;
    auVar9[8] = 10;
    auVar9._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar9[9] = 10;
    auVar9[10] = 10;
    auVar9[0xb] = 10;
    auVar9[0xc] = 10;
    auVar9[0xd] = 10;
    auVar9[0xe] = 10;
    auVar9[0xf] = 10;
    auVar9[0x10] = 10;
    auVar9[0x11] = 10;
    auVar9[0x12] = 10;
    auVar9[0x13] = 10;
    auVar9[0x14] = 10;
    auVar9[0x15] = 10;
    auVar9[0x16] = 10;
    auVar9[0x17] = 10;
    auVar9[0x18] = 10;
    auVar9[0x19] = 10;
    auVar9[0x1a] = 10;
    auVar9[0x1b] = 10;
    auVar9[0x1c] = 10;
    auVar9[0x1d] = 10;
    auVar9[0x1e] = 10;
    auVar9[0x1f] = 10;
    auVar10[8] = 0xd;
    auVar10._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar10[9] = 0xd;
    auVar10[10] = 0xd;
    auVar10[0xb] = 0xd;
    auVar10[0xc] = 0xd;
    auVar10[0xd] = 0xd;
    auVar10[0xe] = 0xd;
    auVar10[0xf] = 0xd;
    auVar10[0x10] = 0xd;
    auVar10[0x11] = 0xd;
    auVar10[0x12] = 0xd;
    auVar10[0x13] = 0xd;
    auVar10[0x14] = 0xd;
    auVar10[0x15] = 0xd;
    auVar10[0x16] = 0xd;
    auVar10[0x17] = 0xd;
    auVar10[0x18] = 0xd;
    auVar10[0x19] = 0xd;
    auVar10[0x1a] = 0xd;
    auVar10[0x1b] = 0xd;
    auVar10[0x1c] = 0xd;
    auVar10[0x1d] = 0xd;
    auVar10[0x1e] = 0xd;
    auVar10[0x1f] = 0xd;
    do {
      auVar1 = *(undefined1 (*) [32])(bytes + (uVar7 - 0x1f));
      uVar2 = vpcmpeqb_avx512vl(auVar1,auVar8);
      uVar3 = vpcmpeqb_avx512vl(auVar1,auVar9);
      uVar4 = vpcmpeqb_avx512vl(auVar1,auVar10);
      sVar5 = sVar5 + (uint)POPCOUNT((uint)uVar2 | (uint)uVar3 | (uint)uVar4);
      uVar7 = uVar7 + 0x20;
    } while (uVar7 < howmany);
  }
  if (uVar6 < howmany) {
    do {
      if (((ulong)(byte)bytes[uVar6] < 0x21) &&
         ((0x100002400U >> ((ulong)(byte)bytes[uVar6] & 0x3f) & 1) != 0)) {
        sVar5 = sVar5 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (howmany != uVar6);
  }
  return sVar5;
}

Assistant:

size_t avx2_countspaces(const char *bytes, size_t howmany) {
  size_t count = 0;
  __m256i spaces = _mm256_set1_epi8(' ');
  __m256i newline = _mm256_set1_epi8('\n');
  __m256i carriage = _mm256_set1_epi8('\r');
  size_t i = 0;
  for (; i + 31 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    // we do it the naive way, could be smarter?
    __m256i xspaces = _mm256_cmpeq_epi8(x, spaces);
    __m256i xnewline = _mm256_cmpeq_epi8(x, newline);
    __m256i xcarriage = _mm256_cmpeq_epi8(x, carriage);
    __m256i anywhite =
        _mm256_or_si256(_mm256_or_si256(xspaces, xnewline), xcarriage);
    count += _mm_popcnt_u32(_mm256_movemask_epi8(anywhite));
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      count++;
    }
  }
  return count;
}